

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result __thiscall
testing::internal::FunctionMockerBase<bool_()>::PerformDefaultAction
          (FunctionMockerBase<bool_()> *this,ArgumentTuple *args,string *call_description)

{
  pointer pcVar1;
  Result RVar2;
  undefined1 uVar3;
  OnCallSpec<bool_()> *this_00;
  Action<bool_()> *this_01;
  string message;
  long *local_38 [2];
  long local_28 [2];
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<bool_()> *)0x0) {
    this_01 = OnCallSpec<bool_()>::GetAction(this_00);
    RVar2 = Action<bool_()>::Perform(this_01,args);
    return RVar2;
  }
  pcVar1 = (call_description->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)local_38);
  if (DefaultValue<bool>::producer_ == (long *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (**(code **)(*DefaultValue<bool>::producer_ + 0x10))();
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return (Result)uVar3;
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }